

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O2

int x86MULSD(uchar *stream,x86XmmReg dst,x86Size size,x86Reg index,int multiplier,x86Reg base,
            int shift)

{
  uint uVar1;
  uint uVar2;
  
  if (size == sQWORD) {
    *stream = 0xf2;
    uVar1 = encodeRex(stream + 1,false,dst,index,base);
    (stream + (ulong)uVar1 + 1)[0] = '\x0f';
    (stream + (ulong)uVar1 + 1)[1] = 'Y';
    uVar2 = encodeAddress(stream + (ulong)uVar1 + 3,index,multiplier,base,shift,(int)(char)dst);
    return (uVar2 + (int)(stream + (ulong)uVar1 + 3)) - (int)stream;
  }
  __assert_fail("size == sQWORD",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Translator_X86.cpp"
                ,0x24d,"int x86MULSD(unsigned char *, x86XmmReg, x86Size, x86Reg, int, x86Reg, int)"
               );
}

Assistant:

int x86MULSD(unsigned char *stream, x86XmmReg dst, x86Size size, x86Reg index, int multiplier, x86Reg base, int shift)
{
	unsigned char *start = stream;

	(void)size;
	assert(size == sQWORD);

	*stream++ = 0xf2;
	stream += encodeRex(stream, false, dst, index, base);
	*stream++ = 0x0f;
	*stream++ = 0x59;
	stream += encodeAddress(stream, index, multiplier, base, shift, (char)dst);

	return int(stream - start);
}